

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject * luaC_newobjdt(lua_State *L,int tt,size_t sz,size_t offset)

{
  global_State *pgVar1;
  void *pvVar2;
  
  pgVar1 = L->l_G;
  pvVar2 = luaM_malloc_(L,sz,tt & 0xf);
  *(byte *)((long)pvVar2 + offset + 9) = pgVar1->currentwhite & 0x18;
  *(char *)((long)pvVar2 + offset + 8) = (char)tt;
  *(GCObject **)((long)pvVar2 + offset) = pgVar1->allgc;
  pgVar1->allgc = (GCObject *)((long)pvVar2 + offset);
  return (GCObject *)((long)pvVar2 + offset);
}

Assistant:

GCObject *luaC_newobjdt (lua_State *L, int tt, size_t sz, size_t offset) {
  global_State *g = G(L);
  char *p = cast_charp(luaM_newobject(L, novariant(tt), sz));
  GCObject *o = cast(GCObject *, p + offset);
  o->marked = luaC_white(g);
  o->tt = tt;
  o->next = g->allgc;
  g->allgc = o;
  return o;
}